

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O3

uint64_t * genMAC(MacCtx_t *mac_context,queue *in,queue *out)

{
  _Bool _Var1;
  chunk *pcVar2;
  chunk *pcVar3;
  uint64_t *hash;
  
  if (in == (queue *)0x0) {
LAB_0010533c:
    hash = (uint64_t *)0x0;
  }
  else {
    pcVar2 = front(in);
    if (pcVar2->action != '\x05') {
      pcVar2 = (chunk *)0x0;
      do {
        pcVar3 = front(in);
        if (pcVar3->action == '\x06') break;
        if (pcVar2 == (chunk *)0x0) {
          pcVar2 = front(in);
          deque(in);
          if (pcVar2->action != '\x04') {
            perror("Bad data in mac queue aborting operation\n");
            destroyChunk(pcVar2);
            goto LAB_0010533c;
          }
          pcVar2->action = mac_context->out_action;
          skeinUpdate(mac_context->skein_context_ptr,(uint8_t *)pcVar2->data,pcVar2->data_size);
        }
        _Var1 = enque(pcVar2,out);
        if (_Var1) {
          pcVar2 = (chunk *)0x0;
        }
        pcVar3 = front(in);
      } while (pcVar3->action != '\x05');
    }
    hash = (uint64_t *)calloc(mac_context->digest_byte_size,1);
    skeinFinal(mac_context->skein_context_ptr,(uint8_t *)hash);
  }
  return hash;
}

Assistant:

uint64_t* genMAC(MacCtx_t* mac_context, queue* in, queue* out)
{
    pdebug("genMAC()\n");

    chunk* update_chunk = NULL;
    uint64_t* mac = NULL;

    //iterate through the queue and generate a MAC for everything in it
    while(in != NULL && front(in)->action != DONE && front(in)->action != MAC)
    {
        //check if we are free to MAC a chunk if so do it
        if(update_chunk == NULL)
        {
            update_chunk = front(in);
            deque(in); //pop the 
            if(update_chunk->action != GEN_MAC) //sanity check
            {
                 perror("Bad data in mac queue aborting operation\n");
                 destroyChunk(update_chunk);
                 return NULL;
            }

            //set the chunk action to WRITE
            update_chunk->action = mac_context->out_action;
            skeinUpdate(mac_context->skein_context_ptr,
                        (const uint8_t*)update_chunk->data,
                        update_chunk->data_size);   
        }

        if(update_chunk != NULL && enque(update_chunk, out) == true) //attempt to queue the chunk
        {
            update_chunk = NULL;
            //Set mac chunk to NULL so the next chunk will be maced
        }
        //otherwise spin and wait for the queue to empty
    }

    if(in != NULL)
    {
        mac = calloc(mac_context->digest_byte_size, sizeof(uint8_t));
        skeinFinal(mac_context->skein_context_ptr, (uint8_t*)mac);
    } 
    
    return mac;
}